

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  void *pvVar2;
  FailureReporterInterface *pFVar3;
  long *plVar4;
  char *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  bool bVar5;
  Expectation EVar6;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  plVar4 = *(long **)((long)&(exp->source_text_).field_2 + 8);
  bVar5 = plVar4 == *(long **)&exp->cardinality_specified_;
  if (!bVar5) {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar4;
    while (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX) {
      plVar4 = plVar4 + 2;
      bVar5 = plVar4 == *(long **)&exp->cardinality_specified_;
      if (bVar5) goto LAB_001282a5;
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar4;
    }
    this->_vptr_UntypedFunctionMockerBase = (_func_int **)p_Var1;
    pvVar2 = (void *)plVar4[1];
    this->mock_obj_ = pvVar2;
    if (pvVar2 != (void *)0x0) {
      in_RDX = &__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)pvVar2 + 8) = *(int *)((long)pvVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)pvVar2 + 8) = *(int *)((long)pvVar2 + 8) + 1;
      }
    }
    if (!bVar5) goto LAB_00128300;
  }
LAB_001282a5:
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Cannot find expectation.","");
  pFVar3 = GetFailureReporter();
  (*pFVar3->_vptr_FailureReporterInterface[2])
            (pFVar3,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/third_party/googletest/googlemock/src/gmock-spec-builders.cc"
             ,500,local_30);
  in_RDX = (char *)extraout_RDX;
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
    in_RDX = (char *)extraout_RDX_00;
  }
  this->_vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
  this->mock_obj_ = (void *)0x0;
LAB_00128300:
  EVar6.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  EVar6.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Expectation)
         EVar6.expectation_base_.
         super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}